

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9eb85::CleanTestCleanDepFileAndRspFileWithSpaces::Run
          (CleanTestCleanDepFileAndRspFileWithSpaces *this)

{
  State *state;
  VirtualFileSystem *this_00;
  DyndepLoader *pDVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Test *pTVar4;
  int iVar5;
  TimeStamp TVar6;
  string err;
  Cleaner cleaner;
  string local_108;
  string local_e8;
  Cleaner local_c8;
  
  iVar5 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cc_dep\n  command = cc $in > $out\n  depfile = $out.d\nrule cc_rsp\n  command = cc $in > $out\n  rspfile = $out.rsp\n  rspfile_content = $in\nbuild out$ 1: cc_dep in$ 1\nbuild out$ 2: cc_rsp in$ 1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar5 == g_current_test->assertion_failures_) {
    pDVar1 = &local_c8.dyndep_loader_;
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out 1","");
    paVar2 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out 2","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out 1.d","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out 2.rsp","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    pTVar4 = g_current_test;
    iVar5 = Cleaner::CleanAll(&local_c8,false);
    testing::Test::Check
              (pTVar4,iVar5 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1ca,"0 == cleaner.CleanAll()");
    testing::Test::Check
              (g_current_test,local_c8.cleaned_files_count_ == 4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cb,"4 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cc,"4u == fs_.files_removed_.size()");
    pTVar4 = g_current_test;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_e8.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar2;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out 1","");
    TVar6 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
    testing::Test::Check
              (pTVar4,TVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1cf,"0 == fs_.Stat(\"out 1\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out 2","");
    TVar6 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
    testing::Test::Check
              (pTVar4,TVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d0,"0 == fs_.Stat(\"out 2\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out 1.d","");
    TVar6 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
    testing::Test::Check
              (pTVar4,TVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d1,"0 == fs_.Stat(\"out 1.d\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    local_e8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out 2.rsp","");
    TVar6 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
    testing::Test::Check
              (pTVar4,TVar6 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1d2,"0 == fs_.Stat(\"out 2.rsp\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar3) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    ~_Rb_tree(&local_c8.cleaned_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c8.removed_._M_t);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDepFileAndRspFileWithSpaces) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc_dep\n"
"  command = cc $in > $out\n"
"  depfile = $out.d\n"
"rule cc_rsp\n"
"  command = cc $in > $out\n"
"  rspfile = $out.rsp\n"
"  rspfile_content = $in\n"
"build out$ 1: cc_dep in$ 1\n"
"build out$ 2: cc_rsp in$ 1\n"
));
  fs_.Create("out 1", "");
  fs_.Create("out 2", "");
  fs_.Create("out 1.d", "");
  fs_.Create("out 2.rsp", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(4, cleaner.cleaned_files_count());
  EXPECT_EQ(4u, fs_.files_removed_.size());

  string err;
  EXPECT_EQ(0, fs_.Stat("out 1", &err));
  EXPECT_EQ(0, fs_.Stat("out 2", &err));
  EXPECT_EQ(0, fs_.Stat("out 1.d", &err));
  EXPECT_EQ(0, fs_.Stat("out 2.rsp", &err));
}